

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureArrayPrototypeValuesFunction(JavascriptLibrary *this)

{
  bool bVar1;
  JavascriptFunction **ppJVar2;
  ScriptContext *this_00;
  RuntimeFunction *ptr;
  ScriptContext **ppSVar3;
  JavascriptLibrary *this_local;
  
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->arrayPrototypeValuesFunction);
  if (*ppJVar2 == (JavascriptFunction *)0x0) {
    this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar1 = ScriptContext::IsJsBuiltInEnabled(this_00);
    if (bVar1) {
      ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      EnsureBuiltInEngineIsReady(Array_prototype,*ppSVar3);
    }
    else {
      ptr = DefaultCreateFunction
                      (this,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Values,0,
                       (DynamicObject *)0x0,(DynamicType *)0x0,399);
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
                (&this->arrayPrototypeValuesFunction,&ptr->super_JavascriptFunction);
    }
  }
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->arrayPrototypeValuesFunction);
  return *ppJVar2;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureArrayPrototypeValuesFunction()
    {
        if (arrayPrototypeValuesFunction == nullptr)
        {
#ifndef ENABLE_JS_BUILTINS
            arrayPrototypeValuesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Values, 0, nullptr, nullptr, PropertyIds::values);
#else
            if (!scriptContext->IsJsBuiltInEnabled())
            {
                arrayPrototypeValuesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Values, 0, nullptr, nullptr, PropertyIds::values);
            }
            else
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
            }
#endif
        }
        return arrayPrototypeValuesFunction;
    }